

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::DatabaseInterface::import_metadata_from_os_handle
          (DatabaseInterface *this,intptr_t handle)

{
  bool bVar1;
  LogLevel LVar2;
  int iVar3;
  void *data_;
  int __fd;
  stat s;
  stat sStack_b8;
  
  if (((this->impl->whitelist)._M_t.
       super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
       ._M_t.
       super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
       .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl ==
       (DatabaseInterface *)0x0) &&
     ((this->impl->blacklist)._M_t.
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl ==
      (DatabaseInterface *)0x0)) {
    memset(&sStack_b8,0,0x90);
    __fd = (int)handle;
    iVar3 = fstat(__fd,&sStack_b8);
    if (iVar3 < 0) {
      return false;
    }
    if (sStack_b8.st_size != 0) {
      data_ = mmap((void *)0x0,sStack_b8.st_size,1,1,__fd,0);
      if (data_ == (void *)0xffffffffffffffff) {
        return false;
      }
      bVar1 = Impl::parse_imported_metadata(this->impl,data_,sStack_b8.st_size);
      if (bVar1) {
        close(__fd);
        return true;
      }
      munmap(data_,sStack_b8.st_size);
    }
  }
  else {
    LVar2 = get_thread_log_level();
    if ((int)LVar2 < 3) {
      bVar1 = Internal::log_thread_callback
                        (LOG_ERROR,"Cannot use imported metadata along with white- or blacklists.\n"
                        );
      if (bVar1) {
        return false;
      }
      import_metadata_from_os_handle();
    }
  }
  return false;
}

Assistant:

bool DatabaseInterface::import_metadata_from_os_handle(intptr_t handle)
{
	if (impl->whitelist || impl->blacklist)
	{
		LOGE_LEVEL("Cannot use imported metadata along with white- or blacklists.\n");
		return false;
	}

#ifdef _WIN32
	HANDLE mapping_handle = reinterpret_cast<HANDLE>(handle);
	void *mapped = MapViewOfFile(mapping_handle, FILE_MAP_READ, 0, 0, 0);
	if (!mapped)
		return false;

	// There is no documented way to query size of a file mapping handle in Windows (?!?!), so rely on parsing the metadata.
	// As long as we find valid records within the bounds of the VirtualQuery, we will be fine.
	MEMORY_BASIC_INFORMATION info;
	if (!VirtualQuery(mapped, &info, sizeof(info)))
	{
		UnmapViewOfFile(mapped);
		return false;
	}

	bool ret = impl->parse_imported_metadata(mapped, info.RegionSize);
	if (ret)
		CloseHandle(mapping_handle);
	else
		UnmapViewOfFile(mapped);
	return ret;
#else
	int fd = int(handle);
	struct stat s = {};
	if (fstat(fd, &s) < 0)
		return false;

	if (s.st_size == 0)
		return false;

	void *mapped = mmap(nullptr, s.st_size, PROT_READ, MAP_SHARED, fd, 0);
	if (mapped == MAP_FAILED)
		return false;

	bool ret = impl->parse_imported_metadata(mapped, s.st_size);
	if (ret)
		close(fd);
	else
		munmap(mapped, s.st_size);

	return ret;
#endif
}